

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reducer_impl.cpp
# Opt level: O0

size_t roundup(size_t nmax)

{
  size_t sVar1;
  size_t in_RDI;
  size_t sz;
  
  sVar1 = sizeof_bucket(in_RDI);
  sVar1 = __cilkrts_frame_malloc_roundup(sVar1);
  return (sVar1 - 0x20) / 0x18;
}

Assistant:

static size_t roundup(size_t nmax)
{
    size_t sz = sizeof_bucket(nmax);

    /* round up size to a full malloc block */
    sz = __cilkrts_frame_malloc_roundup(sz);

    /* invert sizeof_bucket() */
    nmax = ((sz - sizeof(bucket)) / sizeof(elem));
     
    return nmax;
}